

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

Population * __thiscall
Population::tournament_selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  pointer pCVar1;
  Population *pPVar2;
  int iVar3;
  long lVar4;
  pointer pCVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  Chromosome winner;
  vector<Chromosome,_std::allocator<Chromosome>_> local_c8;
  Population *local_b0;
  vector<Chromosome,_std::allocator<Chromosome>_> local_a8;
  Chromosome local_90;
  
  local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) *
          -0x5555555555555555;
  local_b0 = __return_storage_ptr__;
  if ((int)uVar6 != 0) {
    uVar8 = uVar6 & 0xffffffff;
    do {
      iVar3 = rand();
      lVar4 = (long)iVar3 % (long)uVar6;
      iVar3 = rand();
      if (pCVar1[lVar4].fitness < pCVar1[(long)iVar3 % (long)uVar6].fitness ||
          pCVar1[lVar4].fitness == pCVar1[(long)iVar3 % (long)uVar6].fitness) {
        lVar4 = (long)iVar3 % (long)uVar6;
      }
      pCVar5 = pCVar1 + lVar4;
      local_90.id = pCVar5->id;
      std::vector<TURNCODE,_std::allocator<TURNCODE>_>::vector(&local_90.turnList,&pCVar5->turnList)
      ;
      std::
      vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
      ::vector(&local_90.pairs,&pCVar5->pairs);
      local_90._64_5_ = SUB85((ulong)*(undefined8 *)((long)&pCVar5->fitness + 5) >> 0x18,0);
      local_90.fitness._0_5_ = SUB85(pCVar5->fitness,0);
      local_90.fitness._5_3_ = (undefined3)((ulong)pCVar5->fitness >> 0x28);
      std::vector<Coordinate,_std::allocator<Coordinate>_>::vector
                (&local_90.pathList,&pCVar5->pathList);
      std::vector<Chromosome,_std::allocator<Chromosome>_>::emplace_back<Chromosome>
                (&local_c8,&local_90);
      if (local_90.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.pathList.
                        super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.pathList.
                              super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.pathList.
                              super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_90.pairs.
          super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.pairs.
                        super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.pairs.
                              super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.pairs.
                              super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.turnList.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.turnList.super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.turnList.
                              super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.turnList.
                              super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector(&local_a8,&local_c8);
  pPVar2 = local_b0;
  Population(local_b0,&local_a8);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_a8);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_c8);
  return pPVar2;
}

Assistant:

Population Population::tournament_selection(int generation) {

    std::vector<Chromosome> new_chromosomes;


    //Fisher-Yates shuffle
    int t_rounds = (int) chromosomes.size();
    //std::cout << crossover_count << std::endl;

    long left = std::distance(chromosomes.begin(), chromosomes.end());
    auto current = chromosomes.begin();

    while (t_rounds) {
        auto rI1 = current;
        auto rI2 = current;
        std::advance(rI1, rand() % left);
        std::advance(rI2, rand() % left);
        //std::swap(*current, *r);
        Chromosome &ch1 = (*(rI1));
        Chromosome &ch2 = (*(rI2));

        Chromosome winner = (ch1.getFitness() > ch2.getFitness()) ? ch1 : ch2;
        new_chromosomes.push_back(std::move(winner));

        --t_rounds;
    }

/*
    static const float t = 0.6f;
    std::uniform_int_distribution<int> uniform_dist(0, chromosomes.size());

    for (size_t i = 0; i < chromosomes.size(); ++i) {
        Chromosome* c1 = nullptr;
        while (!c1){
            int index = uniform_dist(randomEngine) - 1;

            Chromosome& c = chromosomes[index];
            if (&c != c1) {
                c1 = &c;
            }
        }

        Chromosome* c2 = nullptr;
        while (!c2) {
            int index = uniform_dist(randomEngine) - 1;
            Chromosome& c = chromosomes[index];
            if (&c != c2) {
                c2 = &c;
            }
        }



        float r = static_cast <float> (rand()) / static_cast <float> (RAND_MAX);
        if (r >= t) {
            winner = *c2;
        }

        new_chromosomes.push_back(std::move(winner));

    }
*/
    return Population(new_chromosomes);

 }